

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

int xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  byte *pbVar1;
  xmlSchemaContentType xVar2;
  xmlSchemaContentType xVar3;
  xmlSchemaTypeType xVar4;
  void *pvVar5;
  long lVar6;
  xmlSchemaWildcardPtr pxVar7;
  xmlSchemaWildcardPtr pxVar8;
  xmlSchemaWildcardNsPtr pxVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  xmlNodePtr pxVar13;
  xmlSchemaTypePtr pxVar14;
  xmlSchemaTypePtr pxVar15;
  xmlSchemaItemListPtr pxVar16;
  ulong uVar17;
  xmlSchemaWildcardNsPtr pxVar18;
  xmlSchemaTypePtr pxVar19;
  xmlSchemaModelGroupPtr pxVar20;
  xmlSchemaParticlePtr pxVar21;
  xmlSchemaWildcardNsPtr pxVar22;
  xmlChar *pxVar23;
  xmlChar *str2;
  xmlSchemaWildcardNsPtr pxVar24;
  uint uVar25;
  ulong uVar26;
  _xmlSchemaWildcardNs *p_Var27;
  bool bVar28;
  xmlSchemaWildcardNsPtr pxVar29;
  char *funcName;
  xmlSchemaParserCtxtPtr type_00;
  long *plVar30;
  ulong uVar31;
  bool bVar32;
  char *pcVar33;
  long lVar34;
  ulong uVar35;
  xmlSchemaItemListPtr pxVar36;
  xmlChar *local_58;
  int local_4c;
  xmlSchemaTypePtr local_48;
  long *local_40;
  xmlChar *local_38;
  
  if (type->type == XML_SCHEMA_TYPE_BASIC) {
    return 0;
  }
  if (((uint)type->flags >> 0x16 & 1) != 0) {
    return 0;
  }
  iVar11 = pctxt->nberrors;
  pxVar14 = type->baseType;
  type->flags = type->flags | 0x400000;
  if (pxVar14 == (xmlSchemaTypePtr)0x0) {
    funcName = "xmlSchemaFixupComplexType";
    pcVar33 = "missing baseType";
    goto LAB_001993d0;
  }
  type_00 = (xmlSchemaParserCtxtPtr)type;
  if ((pxVar14->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar14->flags & 0x400000) == 0)) {
    type_00 = pctxt;
    xmlSchemaTypeFixup(pxVar14,(xmlSchemaAbstractCtxtPtr)pctxt);
  }
  if ((pxVar14->flags & 0x800000) != 0) {
    return 0;
  }
  pxVar15 = type->baseType;
  xVar2 = type->contentType;
  if ((xVar2 | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
    if ((pxVar15->type == XML_SCHEMA_TYPE_SIMPLE) ||
       ((pxVar15->type == XML_SCHEMA_TYPE_BASIC && (pxVar15->builtInType != 0x2d)))) {
      if ((type->flags & 2) != 0) goto LAB_001994c5;
      local_58 = (xmlChar *)0x0;
      pxVar23 = xmlSchemaFormatQName(&local_58,pxVar15->targetNamespace,pxVar15->name);
      pcVar33 = 
      "If using <simpleContent> and <restriction>, the base type must be a complex type. The base type \'%s\' is a simple type"
      ;
LAB_00199468:
      xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
                          pcVar33,pxVar23);
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
      }
    }
    else {
      xVar3 = pxVar15->contentType;
      pcVar33 = 
      "If <simpleContent> and <extension> is used, the base type must be a simple type. The base type \'%s\' is a complex type"
      ;
      if (xVar3 == XML_SCHEMA_CONTENT_MIXED) {
        if ((type->flags & 4) != 0) {
          iVar12 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar15->subtypes);
          if (iVar12 != 0) {
            if (type->contentTypeDef == (xmlSchemaTypePtr)0x0) {
              local_58 = (xmlChar *)0x0;
              pxVar23 = xmlSchemaFormatQName(&local_58,pxVar15->targetNamespace,pxVar15->name);
              pcVar33 = 
              "A <simpleType> is expected among the children of <restriction>, if <simpleContent> is used and the base type \'%s\' is a complex type"
              ;
              goto LAB_00199468;
            }
            goto LAB_001994c5;
          }
          pcVar33 = 
          "If <simpleContent> and <restriction> is used, the base type must be a simple type or a complex type with mixed content and particle emptiable. The base type \'%s\' is none of those"
          ;
        }
      }
      else {
        if ((xVar3 == XML_SCHEMA_CONTENT_SIMPLE) || (xVar3 == XML_SCHEMA_CONTENT_BASIC)) {
          if (pxVar15->contentTypeDef != (xmlSchemaTypePtr)0x0) goto LAB_001994c5;
          pxVar23 = type->name;
          pcVar33 = "Internal error: xmlSchemaCheckSRCCT, \'%s\', base type has no content type";
          goto LAB_0019955d;
        }
        if ((type->flags & 4) != 0) {
          pcVar33 = 
          "If <simpleContent> and <restriction> is used, the base type must be a simple type or a complex type with mixed content and particle emptiable. The base type \'%s\' is none of those"
          ;
        }
      }
      local_58 = (xmlChar *)0x0;
      pxVar23 = xmlSchemaFormatQName(&local_58,pxVar15->targetNamespace,pxVar15->name);
      pxVar13 = (xmlNodePtr)0x0;
LAB_0019965b:
      xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_SRC_CT_1,(xmlSchemaBasicItemPtr)type,pxVar13,pcVar33,
                          pxVar23);
      if (local_58 != (xmlChar *)0x0) {
        (*xmlFree)(local_58);
      }
    }
LAB_00199679:
    pbVar1 = (byte *)((long)&type->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
LAB_0019967d:
    iVar11 = pctxt->err;
  }
  else {
    if ((pxVar15->type != XML_SCHEMA_TYPE_COMPLEX) && (pxVar15->builtInType != 0x2d)) {
      local_58 = (xmlChar *)0x0;
      pxVar13 = type->node;
      pxVar23 = xmlSchemaFormatQName(&local_58,pxVar15->targetNamespace,pxVar15->name);
      pcVar33 = 
      "If using <complexContent>, the base type is expected to be a complex type. The base type \'%s\' is a simple type"
      ;
      goto LAB_0019965b;
    }
LAB_001994c5:
    if (xVar2 == XML_SCHEMA_CONTENT_SIMPLE) {
      xVar4 = pxVar14->type;
      if ((xVar4 == XML_SCHEMA_TYPE_COMPLEX) || (pxVar14->builtInType == 0x2d)) {
        if ((pxVar14->contentTypeDef != (xmlSchemaTypePtr)0x0) && ((type->flags & 4) != 0)) {
          pxVar15 = type->contentTypeDef;
          pxVar14 = pxVar14->contentTypeDef;
          if (pxVar15 != (xmlSchemaTypePtr)0x0) {
            type->contentTypeDef = (xmlSchemaTypePtr)0x0;
            pxVar14 = pxVar15;
          }
          type_00 = (xmlSchemaParserCtxtPtr)
                    xmlSchemaAddType(pctxt,pctxt->schema,XML_SCHEMA_TYPE_SIMPLE,(xmlChar *)0x0,
                                     type->targetNamespace,type->node,0);
          if (type_00 != (xmlSchemaParserCtxtPtr)0x0) {
            type_00->type = XML_SCHEMA_TYPE_SIMPLE;
            *(xmlSchemaTypePtr *)&type_00->size = pxVar14;
            type_00->am = (xmlAutomataPtr)type->facets;
            type->facets = (xmlSchemaFacetPtr)0x0;
            type_00->vctxt = (xmlSchemaValidCtxtPtr)type->facetSet;
            type->facetSet = (xmlSchemaFacetLinkPtr)0x0;
            type->contentTypeDef = (xmlSchemaTypePtr)type_00;
            if ((pxVar14->type != XML_SCHEMA_TYPE_BASIC) && ((pxVar14->flags & 0x400000) == 0)) {
              xmlSchemaTypeFixup(pxVar14,(xmlSchemaAbstractCtxtPtr)pctxt);
            }
            iVar12 = xmlSchemaFixupSimpleTypeStageOne(pctxt,(xmlSchemaTypePtr)type_00);
            if ((iVar12 != -1) &&
               (iVar12 = xmlSchemaFixupSimpleTypeStageTwo(pctxt,(xmlSchemaTypePtr)type_00),
               iVar12 != -1)) {
              if (iVar12 != 0) goto LAB_00199679;
              goto LAB_001998d4;
            }
          }
          goto LAB_001993d5;
        }
        if ((xVar4 != XML_SCHEMA_TYPE_COMPLEX) && (pxVar14->builtInType != 0x2d)) goto LAB_00199534;
        if ((pxVar14->contentType == XML_SCHEMA_CONTENT_MIXED) && ((type->flags & 4) != 0)) {
          if ((type->contentTypeDef != (xmlSchemaTypePtr)0x0) &&
             (type->contentTypeDef->baseType != (xmlSchemaTypePtr)0x0)) goto LAB_001998d4;
          pxVar23 = type->name;
          pcVar33 = 
          "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <simpleContent><restriction> is missing a <simpleType> child, but was not caught by xmlSchemaCheckSRCCT()"
          ;
        }
        else {
          if (((xVar4 != XML_SCHEMA_TYPE_COMPLEX) && (pxVar14->builtInType != 0x2d)) ||
             ((type->flags & 2) == 0)) goto LAB_00199534;
          pxVar14 = pxVar14->contentTypeDef;
          if (pxVar14 != (xmlSchemaTypePtr)0x0) goto LAB_00199813;
          pxVar23 = type->name;
          pcVar33 = 
          "Internal error: xmlSchemaTypeFixup, complex type \'%s\': the <extension>ed base type is a complex type with no simple content type"
          ;
        }
      }
      else {
LAB_00199534:
        if (((xVar4 == XML_SCHEMA_TYPE_SIMPLE) ||
            ((xVar4 == XML_SCHEMA_TYPE_BASIC && (pxVar14->builtInType != 0x2d)))) &&
           ((type->flags & 2) != 0)) {
          type->contentTypeDef = pxVar14;
          goto LAB_001998d4;
        }
        pxVar23 = type->name;
        pcVar33 = 
        "Internal error: xmlSchemaTypeFixup, complex type \'%s\' with <simpleContent>: unhandled derivation case"
        ;
      }
LAB_0019955d:
      xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_INTERNAL,(xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,
                          pcVar33,pxVar23);
      goto LAB_001993d5;
    }
    pxVar15 = type->subtypes;
    if (pxVar15 == (xmlSchemaTypePtr)0x0) {
      if ((type->flags & 1) != 0) {
LAB_0019985b:
        pxVar15 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
        if (pxVar15 != (xmlSchemaTypePtr)0x0) {
          type_00 = (xmlSchemaParserCtxtPtr)pctxt->schema;
          pxVar20 = xmlSchemaAddModelGroup
                              (pctxt,(xmlSchemaPtr)type_00,XML_SCHEMA_TYPE_SEQUENCE,type->node);
          pxVar15->id = (xmlChar *)pxVar20;
          if (pxVar20 != (xmlSchemaModelGroupPtr)0x0) {
            type->subtypes = pxVar15;
            bVar28 = true;
            goto LAB_001995af;
          }
        }
        goto LAB_001993d5;
      }
LAB_001995ed:
      type->contentType = XML_SCHEMA_CONTENT_EMPTY;
      if ((type->flags & 4) == 0) {
        type->contentType = pxVar14->contentType;
        type->subtypes = pxVar14->subtypes;
        pxVar14 = pxVar14->contentTypeDef;
LAB_00199813:
        type->contentTypeDef = pxVar14;
      }
    }
    else {
      if (pxVar15->type == XML_SCHEMA_TYPE_PARTICLE) {
        xVar4 = ((xmlSchemaTreeItemPtr_conflict)pxVar15->id)->type;
        if ((((xVar4 == XML_SCHEMA_TYPE_SEQUENCE) || (xVar4 == XML_SCHEMA_TYPE_ALL)) ||
            ((xVar4 == XML_SCHEMA_TYPE_CHOICE && (*(int *)&pxVar15->ref == 0)))) &&
           (((xmlSchemaTreeItemPtr_conflict)pxVar15->id)->children == (xmlSchemaTreeItemPtr)0x0)) {
          if ((type->flags & 1) != 0) {
            bVar28 = true;
            if (xVar4 != XML_SCHEMA_TYPE_SEQUENCE) goto LAB_0019985b;
            goto LAB_001995af;
          }
          goto LAB_001995ed;
        }
      }
      bVar28 = false;
LAB_001995af:
      type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
      uVar25 = type->flags;
      if (((uVar25 & 4) == 0) && (pxVar14->contentType != XML_SCHEMA_CONTENT_EMPTY)) {
        if ((uVar25 & 1) != 0) {
          type->contentType = XML_SCHEMA_CONTENT_MIXED;
        }
        if (((xmlSchemaTreeItemPtr_conflict)pxVar15->id == (xmlSchemaTreeItemPtr_conflict)0x0) ||
           (((xmlSchemaTreeItemPtr_conflict)pxVar15->id)->type != XML_SCHEMA_TYPE_ALL)) {
          pxVar19 = pxVar14->subtypes;
          if (pxVar19 != (xmlSchemaTypePtr)0x0) {
            if (((int *)pxVar19->id != (int *)0x0) && (*(int *)pxVar19->id == 8)) {
              pxVar13 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
              pcVar33 = 
              "A type cannot be derived by extension from a type which has an \'all\' model group in its {content type}, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
              ;
              goto LAB_001997e4;
            }
            if (!bVar28) {
              pxVar19 = (xmlSchemaTypePtr)xmlSchemaAddParticle(pctxt,type->node,1,1);
              if (pxVar19 != (xmlSchemaTypePtr)0x0) {
                pxVar20 = xmlSchemaAddModelGroup
                                    (pctxt,pctxt->schema,XML_SCHEMA_TYPE_SEQUENCE,type->node);
                pxVar19->id = (xmlChar *)pxVar20;
                if (pxVar20 != (xmlSchemaModelGroupPtr)0x0) {
                  type->subtypes = pxVar19;
                  type_00 = (xmlSchemaParserCtxtPtr)type->node;
                  pxVar21 = xmlSchemaAddParticle
                                      (pctxt,(xmlNodePtr)type_00,*(int *)&pxVar14->subtypes->ref,
                                       *(int *)((long)&pxVar14->subtypes->ref + 4));
                  ((xmlSchemaTreeItemPtr_conflict)pxVar19->id)->children =
                       (xmlSchemaTreeItemPtr)pxVar21;
                  if (pxVar21 != (xmlSchemaParticlePtr)0x0) {
                    pxVar21->children = (xmlSchemaTreeItemPtr_conflict)pxVar14->subtypes->id;
                    pxVar21->next = (xmlSchemaTreeItemPtr_conflict)pxVar15;
                    goto LAB_001998d4;
                  }
                }
              }
              goto LAB_001993d5;
            }
          }
          ((xmlSchemaTreeItemPtr_conflict)pxVar15->id)->children = (xmlSchemaTreeItemPtr)pxVar19;
        }
        else {
          pxVar13 = xmlSchemaGetComponentNode((xmlSchemaBasicItemPtr)type);
          pcVar33 = 
          "The type has an \'all\' model group in its {content type} and thus cannot be derived from a non-empty type, since this would produce a \'sequence\' model group containing the \'all\' model group; \'all\' model groups are not allowed to appear inside other model groups"
          ;
LAB_001997e4:
          type_00 = (xmlSchemaParserCtxtPtr)0xc13;
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_COS_ALL_LIMITED,pxVar13,
                             (xmlSchemaBasicItemPtr)0x0,pcVar33,(xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
      else if ((uVar25 & 1) != 0) {
        type->contentType = XML_SCHEMA_CONTENT_MIXED;
      }
    }
LAB_001998d4:
    pxVar14 = type->baseType;
    if (pxVar14 == (xmlSchemaTypePtr)0x0) {
      funcName = "xmlSchemaFixupTypeAttributeUses";
      pcVar33 = "no base type";
      goto LAB_001993d0;
    }
    local_4c = iVar11;
    local_48 = pxVar14;
    if (((pxVar14->type == XML_SCHEMA_TYPE_BASIC) || ((pxVar14->flags & 0x400000) != 0)) ||
       (type_00 = pctxt, iVar11 = xmlSchemaTypeFixup(pxVar14,(xmlSchemaAbstractCtxtPtr)pctxt),
       iVar11 != -1)) {
      pxVar14 = local_48;
      pxVar16 = (xmlSchemaItemListPtr)type->attrUses;
      local_40 = (long *)local_48->attrUses;
      if (pxVar16 == (xmlSchemaItemListPtr)0x0) {
        pxVar36 = (xmlSchemaItemListPtr)0x0;
LAB_001999cc:
        if (local_40 != (long *)0x0) {
          if ((type->flags & 4) == 0) {
            lVar34 = 0;
            while( true ) {
              iVar11 = (int)local_40[1];
              type_00 = (xmlSchemaParserCtxtPtr)(long)iVar11;
              pxVar14 = local_48;
              if ((long)type_00 <= lVar34) break;
              pvVar5 = *(void **)(*local_40 + lVar34 * 8);
              if (pxVar16 == (xmlSchemaItemListPtr)0x0) {
                pxVar16 = xmlSchemaItemListCreate();
                type->attrUses = pxVar16;
                if (pxVar16 == (xmlSchemaItemListPtr)0x0) goto LAB_001993d5;
                iVar11 = (int)local_40[1];
              }
              xmlSchemaItemListAddSize(pxVar16,iVar11,pvVar5);
              lVar34 = lVar34 + 1;
            }
          }
          else {
            uVar31 = 0;
            if (pxVar16 != (xmlSchemaItemListPtr)0x0) {
              uVar31 = (ulong)(uint)pxVar16->nbItems;
            }
            uVar35 = 0;
            if (0 < (int)uVar31) {
              uVar35 = uVar31;
            }
            plVar30 = local_40;
            for (lVar34 = 0; pxVar14 = local_48, lVar34 < (int)plVar30[1]; lVar34 = lVar34 + 1) {
              pvVar5 = *(void **)(*plVar30 + lVar34 * 8);
              if (pxVar36 != (xmlSchemaItemListPtr)0x0) {
                uVar17 = (ulong)(uint)pxVar36->nbItems;
                if (pxVar36->nbItems < 1) {
                  uVar17 = 0;
                }
                for (uVar26 = 0; uVar17 != uVar26; uVar26 = uVar26 + 1) {
                  if ((*(long *)(*(long *)((long)pvVar5 + 0x18) + 0x10) ==
                       *(long *)((long)pxVar36->items[uVar26] + 0x10)) &&
                     (type_00 = *(xmlSchemaParserCtxtPtr *)(*(long *)((long)pvVar5 + 0x18) + 0x70),
                     type_00 == *(xmlSchemaParserCtxtPtr *)((long)pxVar36->items[uVar26] + 0x18)))
                  goto LAB_00199b17;
                }
              }
              if ((int)uVar31 != 0) {
                for (uVar17 = 0; uVar35 != uVar17; uVar17 = uVar17 + 1) {
                  type_00 = *(xmlSchemaParserCtxtPtr *)(*(long *)((long)pvVar5 + 0x18) + 0x10);
                  lVar6 = *(long *)((long)pxVar16->items[uVar17] + 0x18);
                  if ((type_00 == *(xmlSchemaParserCtxtPtr *)(lVar6 + 0x10)) &&
                     (*(long *)(*(long *)((long)pvVar5 + 0x18) + 0x70) == *(long *)(lVar6 + 0x70)))
                  goto LAB_00199b17;
                }
              }
              if (pxVar16 == (xmlSchemaItemListPtr)0x0) {
                pxVar16 = xmlSchemaItemListCreate();
                type->attrUses = pxVar16;
                if (pxVar16 == (xmlSchemaItemListPtr)0x0) goto LAB_001993d5;
              }
              type_00 = (xmlSchemaParserCtxtPtr)0x2;
              xmlSchemaItemListAddSize(pxVar16,2,pvVar5);
              plVar30 = local_40;
LAB_00199b17:
            }
          }
        }
        if ((pxVar16 != (xmlSchemaItemListPtr)0x0) && (pxVar16->nbItems == 0)) {
          xmlSchemaItemListFree(pxVar16);
          type->attrUses = (void *)0x0;
        }
        if (((type->flags & 2) != 0) &&
           (pxVar7 = pxVar14->attributeWildcard, pxVar7 != (xmlSchemaWildcardPtr)0x0)) {
          pxVar8 = type->attributeWildcard;
          if (pxVar8 == (xmlSchemaWildcardPtr)0x0) {
            type->attributeWildcard = pxVar7;
          }
          else if (pxVar8->any == pxVar7->any) {
            pxVar24 = pxVar8->nsSet;
            pxVar29 = pxVar7->nsSet;
            if ((pxVar24 == (xmlSchemaWildcardNsPtr)0x0) != (pxVar29 != (xmlSchemaWildcardNsPtr)0x0)
               ) {
              pxVar18 = pxVar8->negNsSet;
              pxVar9 = pxVar7->negNsSet;
              type_00 = (xmlSchemaParserCtxtPtr)
                        CONCAT71((int7)((ulong)type_00 >> 8),pxVar9 != (xmlSchemaWildcardNsPtr)0x0);
              if (((pxVar18 == (xmlSchemaWildcardNsPtr)0x0) !=
                   (pxVar9 != (xmlSchemaWildcardNsPtr)0x0)) &&
                 ((pxVar18 == (xmlSchemaWildcardNsPtr)0x0 || (pxVar18->value == pxVar9->value)))) {
                if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                  bVar28 = true;
                  for (p_Var27 = pxVar24; pxVar18 = (xmlSchemaWildcardNsPtr)&pxVar7->nsSet,
                      p_Var27 != (xmlSchemaWildcardNsPtr)0x0; p_Var27 = p_Var27->next) {
                    do {
                      pxVar18 = pxVar18->next;
                      if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_00199bc5;
                      type_00 = (xmlSchemaParserCtxtPtr)p_Var27->value;
                    } while (type_00 != (xmlSchemaParserCtxtPtr)pxVar18->value);
                    bVar28 = false;
                  }
                  if (bVar28) goto LAB_00199bc5;
                }
                goto LAB_00199fc8;
              }
            }
LAB_00199bc5:
            if ((pxVar24 == (xmlSchemaWildcardNsPtr)0x0) || (pxVar29 == (xmlSchemaWildcardNsPtr)0x0)
               ) {
              pxVar18 = pxVar8->negNsSet;
              pxVar9 = pxVar7->negNsSet;
              if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) {
LAB_00199da7:
                if (((pxVar9 == (xmlSchemaWildcardNsPtr)0x0) ||
                    (pxVar24 == (xmlSchemaWildcardNsPtr)0x0)) ||
                   (pxVar22 = pxVar9, p_Var27 = pxVar24, pxVar9->value == (xmlChar *)0x0)) {
                  if (((pxVar18 == (xmlSchemaWildcardNsPtr)0x0) ||
                      (pxVar29 == (xmlSchemaWildcardNsPtr)0x0)) ||
                     (pxVar18->value != (xmlChar *)0x0)) {
                    if (((pxVar9 == (xmlSchemaWildcardNsPtr)0x0) ||
                        (pxVar24 == (xmlSchemaWildcardNsPtr)0x0)) ||
                       (pxVar29 = pxVar24, pxVar9->value != (xmlChar *)0x0)) goto LAB_00199fc8;
                  }
                  else if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar29 = pxVar24;
                  }
                  for (; pxVar29 != (xmlSchemaWildcardNsPtr)0x0; pxVar29 = pxVar29->next) {
                    if (pxVar29->value == (xmlChar *)0x0) {
                      pxVar8->any = 1;
                      if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                        xmlSchemaFreeWildcardNsSet(pxVar24);
                        pxVar8->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                        pxVar18 = pxVar8->negNsSet;
                      }
                      goto joined_r0x00199f7e;
                    }
                  }
                  if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) {
                    if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                      xmlSchemaFreeWildcardNsSet(pxVar24);
                      pxVar8->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                    }
                    pxVar24 = xmlSchemaNewWildcardNsConstraint(pctxt);
                    pxVar8->negNsSet = pxVar24;
                    if (pxVar24 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001993d5;
                    pxVar24->value = (xmlChar *)0x0;
                  }
                }
                else {
LAB_00199dbb:
                  bVar32 = false;
                  bVar28 = false;
                  for (; p_Var27 != (xmlSchemaWildcardNsPtr)0x0; p_Var27 = p_Var27->next) {
                    if (p_Var27->value == (xmlChar *)0x0) {
                      bVar32 = true;
                      bVar10 = bVar28;
                    }
                    else {
                      bVar10 = true;
                      if (p_Var27->value != pxVar22->value) {
                        bVar10 = bVar28;
                      }
                    }
                    if (bVar10 && bVar32) {
                      bVar28 = true;
                      bVar32 = true;
                      break;
                    }
                    bVar28 = bVar10;
                  }
                  type_00 = (xmlSchemaParserCtxtPtr)(ulong)(bVar32 && bVar28);
                  if (bVar32 && bVar28) {
                    pxVar8->any = 1;
                    if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) goto LAB_00199c67;
                    goto joined_r0x00199f7e;
                  }
                  type_00 = (xmlSchemaParserCtxtPtr)(ulong)(!bVar28 || bVar32);
                  if (!bVar28 || bVar32) {
                    type_00 = (xmlSchemaParserCtxtPtr)(ulong)(bVar32 && !bVar28);
                    if (bVar32 && !bVar28) {
                      type_00 = (xmlSchemaParserCtxtPtr)pxVar8->node;
                      xmlSchemaPErr(pctxt,(xmlNodePtr)type_00,0x702,
                                    "The union of the wildcard is not expressible.\n",(xmlChar *)0x0
                                    ,(xmlChar *)0x0);
                    }
                    else if (((pxVar18 == (xmlSchemaWildcardNsPtr)0x0) && (!bVar28)) && (!bVar32)) {
                      if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                        xmlSchemaFreeWildcardNsSet(pxVar24);
                        pxVar8->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                      }
                      pxVar24 = xmlSchemaNewWildcardNsConstraint(pctxt);
                      pxVar8->negNsSet = pxVar24;
                      if (pxVar24 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001993d5;
                      pxVar24->value = pxVar7->negNsSet->value;
                    }
                  }
                  else {
                    if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                      xmlSchemaFreeWildcardNsSet(pxVar24);
                      pxVar8->nsSet = (xmlSchemaWildcardNsPtr)0x0;
                      pxVar18 = pxVar8->negNsSet;
                    }
                    if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) {
                      pxVar18 = xmlSchemaNewWildcardNsConstraint(pctxt);
                      pxVar8->negNsSet = pxVar18;
                      if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001993d5;
                    }
                    pxVar18->value = (xmlChar *)0x0;
                  }
                }
              }
              else {
                if ((pxVar9 == (xmlSchemaWildcardNsPtr)0x0) || (pxVar18->value == pxVar9->value)) {
                  if ((pxVar29 == (xmlSchemaWildcardNsPtr)0x0) || (pxVar18->value == (xmlChar *)0x0)
                     ) goto LAB_00199da7;
                  pxVar22 = pxVar18;
                  p_Var27 = pxVar29;
                  if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
                    pxVar22 = pxVar9;
                    p_Var27 = pxVar24;
                  }
                  goto LAB_00199dbb;
                }
                pxVar18->value = (xmlChar *)0x0;
              }
            }
            else {
              for (; pxVar29 != (xmlSchemaWildcardNsPtr)0x0; pxVar29 = pxVar29->next) {
                for (p_Var27 = pxVar24; p_Var27 != (xmlSchemaWildcardNsPtr)0x0;
                    p_Var27 = p_Var27->next) {
                  if (pxVar29->value == p_Var27->value) goto LAB_00199c24;
                }
                pxVar18 = xmlSchemaNewWildcardNsConstraint(pctxt);
                if (pxVar18 == (xmlSchemaWildcardNsPtr)0x0) goto LAB_001993d5;
                pxVar18->value = pxVar29->value;
                pxVar18->next = pxVar8->nsSet;
                pxVar8->nsSet = pxVar18;
LAB_00199c24:
              }
            }
          }
          else if (pxVar8->any == 0) {
            pxVar8->any = 1;
            pxVar24 = pxVar8->nsSet;
            if (pxVar24 != (xmlSchemaWildcardNsPtr)0x0) {
LAB_00199c67:
              xmlSchemaFreeWildcardNsSet(pxVar24);
              pxVar8->nsSet = (xmlSchemaWildcardNsPtr)0x0;
            }
            pxVar18 = pxVar8->negNsSet;
joined_r0x00199f7e:
            if (pxVar18 != (xmlSchemaWildcardNsPtr)0x0) {
              (*xmlFree)(pxVar18);
              pxVar8->negNsSet = (xmlSchemaWildcardNsPtr)0x0;
            }
          }
        }
LAB_00199fc8:
        pxVar14 = type->baseType;
        if ((pxVar14 != (xmlSchemaTypePtr)0x0) &&
           (((pxVar14->type == XML_SCHEMA_TYPE_SIMPLE ||
             ((pxVar14->type == XML_SCHEMA_TYPE_BASIC && (pxVar14->builtInType != 0x2d)))) &&
            ((type->flags & 2) == 0)))) {
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_SRC_CT_1,(xmlNodePtr)0x0,
                             (xmlSchemaBasicItemPtr)type,
                             "If the base type is a simple type, the derivation method must be \'extension\'"
                             ,(xmlChar *)0x0,(xmlChar *)0x0);
          goto LAB_00199679;
        }
        pxVar16 = (xmlSchemaItemListPtr)type->attrUses;
        if ((pxVar16 != (xmlSchemaItemListPtr)0x0) && (1 < (long)pxVar16->nbItems)) {
          uVar31 = (long)pxVar16->nbItems;
          bVar28 = true;
          do {
            do {
              bVar32 = bVar28;
              if ((long)uVar31 < 1) goto LAB_0019a184;
              uVar35 = uVar31 - 1;
              pvVar5 = pxVar16->items[uVar31 - 1];
              if (uVar31 != 1) {
                for (uVar25 = (int)uVar31 - 2; -1 < (int)uVar25; uVar25 = uVar25 - 1) {
                  type_00 = *(xmlSchemaParserCtxtPtr *)((long)pxVar16->items[uVar25] + 0x18);
                  if ((*(xmlSchemaValidityErrorFunc *)(*(long *)((long)pvVar5 + 0x18) + 0x10) ==
                       type_00->error) &&
                     (*(xmlSchemaTypePtr *)(*(long *)((long)pvVar5 + 0x18) + 0x70) ==
                      *(xmlSchemaTypePtr *)&type_00->size)) {
                    local_58 = (xmlChar *)0x0;
                    pxVar23 = xmlSchemaGetComponentDesignation(&local_58,pvVar5);
                    xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                                       (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)type,"Duplicate %s",
                                       pxVar23,(xmlChar *)0x0);
                    if (local_58 != (xmlChar *)0x0) {
                      (*xmlFree)(local_58);
                    }
                    type_00 = (xmlSchemaParserCtxtPtr)(uVar35 & 0xffffffff);
                    iVar11 = xmlSchemaItemListRemove(pxVar16,(int)uVar35);
                    goto joined_r0x0019a105;
                  }
                }
              }
              pxVar14 = *(xmlSchemaTypePtr *)(*(long *)((long)pvVar5 + 0x18) + 0x60);
              uVar31 = uVar35;
              bVar28 = bVar32;
            } while (((pxVar14 == (xmlSchemaTypePtr)0x0) ||
                     (iVar11 = xmlSchemaIsDerivedFromBuiltInType(pxVar14,(int)type_00), iVar11 == 0)
                     ) || (bVar28 = false, bVar32));
            local_58 = (xmlChar *)0x0;
            pxVar23 = xmlSchemaGetComponentDesignation(&local_58,pvVar5);
            xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_AG_PROPS_CORRECT,
                               (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)type,
                               "There must not exist more than one attribute declaration of type \'xs:ID\' (or derived from \'xs:ID\'). The %s violates this constraint"
                               ,pxVar23,(xmlChar *)0x0);
            if (local_58 != (xmlChar *)0x0) {
              (*xmlFree)(local_58);
            }
            type_00 = (xmlSchemaParserCtxtPtr)(uVar35 & 0xffffffff);
            iVar11 = xmlSchemaItemListRemove(pxVar16,(int)uVar35);
            bVar32 = false;
joined_r0x0019a105:
            uVar31 = uVar35;
            bVar28 = bVar32;
          } while (iVar11 != -1);
          goto LAB_001993d5;
        }
LAB_0019a184:
        pxVar14 = type->baseType;
        if ((type->flags & 2) != 0) {
          iVar11 = local_4c;
          if ((pxVar14->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar14->builtInType == 0x2d)) {
            if ((pxVar14->flags & 0x200) != 0) goto LAB_0019a406;
            if (((type->contentTypeDef != (xmlSchemaTypePtr)0x0) &&
                (type->contentTypeDef == pxVar14->contentTypeDef)) ||
               ((xVar2 = type->contentType, xVar2 == XML_SCHEMA_CONTENT_EMPTY &&
                (pxVar14->contentType == XML_SCHEMA_CONTENT_EMPTY)))) goto switchD_0019a22f_caseD_2;
            if (type->subtypes == (xmlSchemaTypePtr)0x0) {
              pcVar33 = "The content type must specify a particle";
            }
            else {
              if ((pxVar14->contentType == XML_SCHEMA_CONTENT_EMPTY) ||
                 ((xVar2 & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS &&
                  pxVar14->contentType == xVar2)) goto switchD_0019a22f_caseD_2;
              pcVar33 = 
              "The content type of both, the type and its base type, must either \'mixed\' or \'element-only\'"
              ;
            }
          }
          else {
            if (type->contentTypeDef != pxVar14) {
              pcVar33 = "The content type must be the simple base type";
              goto LAB_0019a40d;
            }
            if ((pxVar14->flags & 0x200) == 0) goto switchD_0019a22f_caseD_2;
LAB_0019a406:
            pcVar33 = "The \'final\' of the base type definition contains \'extension\'";
          }
LAB_0019a40d:
          xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_COS_CT_EXTENDS_1_1,(xmlSchemaBasicItemPtr)type,
                              (xmlNodePtr)0x0,pcVar33,(xmlChar *)0x0);
          goto LAB_00199679;
        }
        if ((pxVar14->type == XML_SCHEMA_TYPE_COMPLEX) || (pxVar14->builtInType == 0x2d)) {
          if ((pxVar14->flags & 0x400) != 0) {
            pxVar13 = type->node;
            pcVar33 = "The \'final\' of the base type definition contains \'restriction\'";
            goto LAB_0019a3a4;
          }
          iVar12 = xmlSchemaCheckDerivationOKRestriction2to4
                             (pctxt,0,(xmlSchemaBasicItemPtr)type,(xmlSchemaBasicItemPtr)pxVar14,
                              (xmlSchemaItemListPtr)type->attrUses,
                              (xmlSchemaItemListPtr)pxVar14->attrUses,type->attributeWildcard,
                              pxVar14->attributeWildcard);
          iVar11 = local_4c;
          if (iVar12 == -1) goto LAB_001993d5;
          if (pxVar14->builtInType == 0x2d) goto switchD_0019a22f_caseD_2;
          switch(type->contentType) {
          case XML_SCHEMA_CONTENT_EMPTY:
            if (pxVar14->contentType - XML_SCHEMA_CONTENT_ELEMENTS < 2) {
              iVar12 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar14->subtypes);
              if (iVar12 == 0) {
LAB_0019a48b:
                pcVar33 = 
                "The content type of the base type must be either empty or \'mixed\' (or \'elements-only\') and an emptiable particle"
                ;
                goto LAB_0019a492;
              }
            }
            else if (pxVar14->contentType != XML_SCHEMA_CONTENT_EMPTY) goto LAB_0019a48b;
            break;
          case XML_SCHEMA_CONTENT_ELEMENTS:
            break;
          case XML_SCHEMA_CONTENT_MIXED:
            if (pxVar14->contentType != XML_SCHEMA_CONTENT_MIXED) {
              pcVar33 = 
              "If the content type is \'mixed\', then the content type of the base type must also be \'mixed\'"
              ;
              goto LAB_0019a492;
            }
            break;
          case XML_SCHEMA_CONTENT_SIMPLE:
          case XML_SCHEMA_CONTENT_BASIC:
            xVar2 = pxVar14->contentType;
            if (xVar2 != XML_SCHEMA_CONTENT_MIXED) {
              if ((xVar2 != XML_SCHEMA_CONTENT_BASIC) && (xVar2 != XML_SCHEMA_CONTENT_SIMPLE))
              goto LAB_0019a479;
              iVar12 = xmlSchemaCheckCOSSTDerivedOK
                                 ((xmlSchemaAbstractCtxtPtr)pctxt,type->contentTypeDef,
                                  pxVar14->contentTypeDef,0);
              if (iVar12 == 0) break;
              local_58 = (xmlChar *)0x0;
              local_38 = (xmlChar *)0x0;
              if (iVar12 == -1) {
                iVar12 = -1;
              }
              else {
                pxVar23 = xmlSchemaGetComponentDesignation(&local_58,type->contentTypeDef);
                str2 = xmlSchemaGetComponentDesignation(&local_38,pxVar14->contentTypeDef);
                xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,
                                   XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,(xmlNodePtr)0x0,
                                   (xmlSchemaBasicItemPtr)type,
                                   "The {content type} %s is not validly derived from the base type\'s {content type} %s"
                                   ,pxVar23,str2);
                if (local_58 != (xmlChar *)0x0) {
                  (*xmlFree)(local_58);
                }
                if (local_38 != (xmlChar *)0x0) {
                  (*xmlFree)(local_38);
                }
                iVar12 = pctxt->err;
              }
              goto LAB_0019a3bb;
            }
            iVar12 = xmlSchemaIsParticleEmptiable((xmlSchemaParticlePtr)pxVar14->subtypes);
            if (iVar12 == 0) {
LAB_0019a479:
              pcVar33 = 
              "The content type of the base type must be either a simple type or \'mixed\' and an emptiable particle"
              ;
              goto LAB_0019a492;
            }
            break;
          default:
            pcVar33 = "The type is not a valid restriction of its base type";
LAB_0019a492:
            xmlSchemaPCustomErr(pctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1,
                                (xmlSchemaBasicItemPtr)type,(xmlNodePtr)0x0,pcVar33,(xmlChar *)0x0);
            iVar12 = pctxt->err;
            goto LAB_0019a3bb;
          }
        }
        else {
          pxVar13 = type->node;
          pcVar33 = "The base type must be a complex type";
LAB_0019a3a4:
          xmlSchemaCustomErr((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_DERIVATION_OK_RESTRICTION_1
                             ,pxVar13,(xmlSchemaBasicItemPtr)type,pcVar33,(xmlChar *)0x0,
                             (xmlChar *)0x0);
          iVar12 = pctxt->err;
LAB_0019a3bb:
          if (iVar12 == -1) goto LAB_001993d5;
          iVar11 = local_4c;
          if (iVar12 != 0) goto LAB_00199679;
        }
switchD_0019a22f_caseD_2:
        if (iVar11 == pctxt->nberrors) {
          return 0;
        }
        goto LAB_0019967d;
      }
      if ((type->flags & 4) == 0) {
        type_00 = (xmlSchemaParserCtxtPtr)type;
        iVar11 = xmlSchemaExpandAttributeGroupRefs
                           (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,pxVar16,
                            (xmlSchemaItemListPtr)0x0);
        pxVar36 = (xmlSchemaItemListPtr)0x0;
        if (iVar11 != -1) goto LAB_001999cc;
        funcName = "xmlSchemaFixupTypeAttributeUses";
        pcVar33 = "failed to expand attributes";
      }
      else {
        type_00 = (xmlSchemaParserCtxtPtr)type;
        iVar11 = xmlSchemaExpandAttributeGroupRefs
                           (pctxt,(xmlSchemaBasicItemPtr)type,&type->attributeWildcard,pxVar16,
                            pctxt->attrProhibs);
        if (iVar11 != -1) {
          pxVar36 = (xmlSchemaItemListPtr)0x0;
          if (pctxt->attrProhibs->nbItems != 0) {
            pxVar36 = pctxt->attrProhibs;
          }
          goto LAB_001999cc;
        }
        funcName = "xmlSchemaFixupTypeAttributeUses";
        pcVar33 = "failed to expand attributes";
      }
LAB_001993d0:
      xmlSchemaInternalErr((xmlSchemaAbstractCtxtPtr)pctxt,funcName,pcVar33);
    }
LAB_001993d5:
    pbVar1 = (byte *)((long)&type->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
    iVar11 = -1;
  }
  return iVar11;
}

Assistant:

static int
xmlSchemaFixupComplexType(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    int res = 0, olderrs = pctxt->nberrors;
    xmlSchemaTypePtr baseType = type->baseType;

    if (! WXS_IS_TYPE_NOT_FIXED(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_RESOLVED;
    if (baseType == NULL) {
	PERROR_INT("xmlSchemaFixupComplexType",
	    "missing baseType");
	goto exit_failure;
    }
    /*
    * Fixup the base type.
    */
    if (WXS_IS_TYPE_NOT_FIXED(baseType))
	xmlSchemaTypeFixup(baseType, ACTXT_CAST pctxt);
    if (baseType->flags & XML_SCHEMAS_TYPE_INTERNAL_INVALID) {
	/*
	* Skip fixup if the base type is invalid.
	* TODO: Generate a warning!
	*/
	return(0);
    }
    /*
    * This basically checks if the base type can be derived.
    */
    res = xmlSchemaCheckSRCCT(pctxt, type);
    HFAILURE HERROR
    /*
    * Fixup the content type.
    */
    if (type->contentType == XML_SCHEMA_CONTENT_SIMPLE) {
	/*
	* Corresponds to <complexType><simpleContent>...
	*/
	if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentTypeDef != NULL) &&
	    (WXS_IS_RESTRICTION(type))) {
	    xmlSchemaTypePtr contentBase, content;
#ifdef ENABLE_NAMED_LOCALS
	    char buf[30];
	    const xmlChar *tmpname;
#endif
	    /*
	    * SPEC (1) If <restriction> + base type is <complexType>,
	    * "whose own {content type} is a simple type..."
	    */
	    if (type->contentTypeDef != NULL) {
		/*
		* SPEC (1.1) "the simple type definition corresponding to the
		* <simpleType> among the [children] of <restriction> if there
		* is one;"
		* Note that this "<simpleType> among the [children]" was put
		* into ->contentTypeDef during parsing.
		*/
		contentBase = type->contentTypeDef;
		type->contentTypeDef = NULL;
	    } else {
		/*
		* (1.2) "...otherwise (<restriction> has no <simpleType>
		* among its [children]), the simple type definition which
		* is the {content type} of the ... base type."
		*/
		contentBase = baseType->contentTypeDef;
	    }
	    /*
	    * SPEC
	    * "... a simple type definition which restricts the simple
	    * type definition identified in clause 1.1 or clause 1.2
	    * with a set of facet components"
	    *
	    * Create the anonymous simple type, which will be the content
	    * type of the complex type.
	    */
#ifdef ENABLE_NAMED_LOCALS
	    snprintf(buf, 29, "#scST%d", ++(pctxt->counter));
	    tmpname = xmlDictLookup(pctxt->dict, BAD_CAST buf, -1);
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, tmpname, type->targetNamespace,
		type->node, 0);
#else
	    content = xmlSchemaAddType(pctxt, pctxt->schema,
		XML_SCHEMA_TYPE_SIMPLE, NULL, type->targetNamespace,
		type->node, 0);
#endif
	    if (content == NULL)
		goto exit_failure;
	    /*
	    * We will use the same node as for the <complexType>
	    * to have it somehow anchored in the schema doc.
	    */
	    content->type = XML_SCHEMA_TYPE_SIMPLE;
	    content->baseType = contentBase;
	    /*
	    * Move the facets, previously anchored on the
	    * complexType during parsing.
	    */
	    content->facets = type->facets;
	    type->facets = NULL;
	    content->facetSet = type->facetSet;
	    type->facetSet = NULL;

	    type->contentTypeDef = content;
	    if (WXS_IS_TYPE_NOT_FIXED(contentBase))
		xmlSchemaTypeFixup(contentBase, ACTXT_CAST pctxt);
	    /*
	    * Fixup the newly created type. We don't need to check
	    * for circularity here.
	    */
	    res = xmlSchemaFixupSimpleTypeStageOne(pctxt, content);
	    HFAILURE HERROR
	    res = xmlSchemaFixupSimpleTypeStageTwo(pctxt, content);
	    HFAILURE HERROR

	} else if ((WXS_IS_COMPLEX(baseType)) &&
	    (baseType->contentType == XML_SCHEMA_CONTENT_MIXED) &&
	    (WXS_IS_RESTRICTION(type))) {
	    /*
	    * SPEC (2) If <restriction> + base is a mixed <complexType> with
	    * an emptiable particle, then a simple type definition which
	    * restricts the <restriction>'s <simpleType> child.
	    */
	    if ((type->contentTypeDef == NULL) ||
		(type->contentTypeDef->baseType == NULL)) {
		/*
		* TODO: Check if this ever happens.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <simpleContent><restriction> "
		    "is missing a <simpleType> child, but was not caught "
		    "by xmlSchemaCheckSRCCT()", type->name);
		goto exit_failure;
	    }
	} else if ((WXS_IS_COMPLEX(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (3) If <extension> + base is <complexType> with
	    * <simpleType> content, "...then the {content type} of that
	    * complex type definition"
	    */
	    if (baseType->contentTypeDef == NULL) {
		/*
		* TODO: Check if this ever happens. xmlSchemaCheckSRCCT
		* should have caught this already.
		*/
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_INTERNAL,
		    WXS_BASIC_CAST type, NULL,
		    "Internal error: xmlSchemaTypeFixup, "
		    "complex type '%s': the <extension>ed base type is "
		    "a complex type with no simple content type",
		    type->name);
		goto exit_failure;
	    }
	    type->contentTypeDef = baseType->contentTypeDef;
	} else if ((WXS_IS_SIMPLE(baseType)) && WXS_IS_EXTENSION(type)) {
	    /*
	    * SPEC (4) <extension> + base is <simpleType>
	    * "... then that simple type definition"
	    */
	    type->contentTypeDef = baseType;
	} else {
	    /*
	    * TODO: Check if this ever happens.
	    */
	    xmlSchemaPCustomErr(pctxt,
		XML_SCHEMAP_INTERNAL,
		WXS_BASIC_CAST type, NULL,
		"Internal error: xmlSchemaTypeFixup, "
		"complex type '%s' with <simpleContent>: unhandled "
		"derivation case", type->name);
	    goto exit_failure;
	}
    } else {
	int dummySequence = 0;
	xmlSchemaParticlePtr particle =
	    (xmlSchemaParticlePtr) type->subtypes;
	/*
	* Corresponds to <complexType><complexContent>...
	*
	* NOTE that the effective mixed was already set during parsing of
	* <complexType> and <complexContent>; its flag value is
	* XML_SCHEMAS_TYPE_MIXED.
	*
	* Compute the "effective content":
	* (2.1.1) + (2.1.2) + (2.1.3)
	*/
	if ((particle == NULL) ||
	    ((particle->type == XML_SCHEMA_TYPE_PARTICLE) &&
	    ((particle->children->type == XML_SCHEMA_TYPE_ALL) ||
	    (particle->children->type == XML_SCHEMA_TYPE_SEQUENCE) ||
	    ((particle->children->type == XML_SCHEMA_TYPE_CHOICE) &&
	    (particle->minOccurs == 0))) &&
	    ( ((xmlSchemaTreeItemPtr) particle->children)->children == NULL))) {
	    if (type->flags & XML_SCHEMAS_TYPE_MIXED) {
		/*
		* SPEC (2.1.4) "If the `effective mixed` is true, then
		* a particle whose properties are as follows:..."
		*
		* Empty sequence model group with
		* minOccurs/maxOccurs = 1 (i.e. a "particle emptiable").
		* NOTE that we sill assign it the <complexType> node to
		* somehow anchor it in the doc.
		*/
		if ((particle == NULL) ||
		    (particle->children->type != XML_SCHEMA_TYPE_SEQUENCE)) {
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the model group.
		    */ /* URGENT TODO: avoid adding to pending items. */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;

		    type->subtypes = (xmlSchemaTypePtr) particle;
		}
		dummySequence = 1;
		type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	    } else {
		/*
		* SPEC (2.1.5) "otherwise empty"
		*/
		type->contentType = XML_SCHEMA_CONTENT_EMPTY;
	    }
	} else {
	    /*
	    * SPEC (2.2) "otherwise the particle corresponding to the
	    * <all>, <choice>, <group> or <sequence> among the
	    * [children]."
	    */
	    type->contentType = XML_SCHEMA_CONTENT_ELEMENTS;
	}
	/*
	* Compute the "content type".
	*/
	if (WXS_IS_RESTRICTION(type)) {
	    /*
	    * SPEC (3.1) "If <restriction>..."
	    * (3.1.1) + (3.1.2) */
	    if (type->contentType != XML_SCHEMA_CONTENT_EMPTY) {
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    }
	} else {
	    /*
	    * SPEC (3.2) "If <extension>..."
	    */
	    if (type->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.1)
		* "If the `effective content` is empty, then the
		*  {content type} of the [...] base ..."
		*/
		type->contentType = baseType->contentType;
		type->subtypes = baseType->subtypes;
		/*
		* Fixes bug #347316:
		* This is the case when the base type has a simple
		* type definition as content.
		*/
		type->contentTypeDef = baseType->contentTypeDef;
		/*
		* NOTE that the effective mixed is ignored here.
		*/
	    } else if (baseType->contentType == XML_SCHEMA_CONTENT_EMPTY) {
		/*
		* SPEC (3.2.2)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
	    } else {
		/*
		* SPEC (3.2.3)
		*/
		if (type->flags & XML_SCHEMAS_TYPE_MIXED)
		    type->contentType = XML_SCHEMA_CONTENT_MIXED;
		    /*
		    * "A model group whose {compositor} is sequence and whose
		    * {particles} are..."
		    */
		if ((WXS_TYPE_PARTICLE(type) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(type) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(type))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"The type has an 'all' model group in its "
			"{content type} and thus cannot be derived from "
			"a non-empty type, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((WXS_TYPE_PARTICLE(baseType) != NULL) &&
		    (WXS_TYPE_PARTICLE_TERM(baseType) != NULL) &&
		    ((WXS_TYPE_PARTICLE_TERM(baseType))->type ==
			XML_SCHEMA_TYPE_ALL))
		{
		    /*
		    * SPEC cos-all-limited (1)
		    */
		    xmlSchemaCustomErr(ACTXT_CAST pctxt,
			/* TODO: error code */
			XML_SCHEMAP_COS_ALL_LIMITED,
			WXS_ITEM_NODE(type), NULL,
			"A type cannot be derived by extension from a type "
			"which has an 'all' model group in its "
			"{content type}, since this would produce a "
			"'sequence' model group containing the 'all' "
			"model group; 'all' model groups are not "
			"allowed to appear inside other model groups",
			NULL, NULL);

		} else if ((!dummySequence) && (baseType->subtypes != NULL)) {
		    xmlSchemaTreeItemPtr effectiveContent =
			(xmlSchemaTreeItemPtr) type->subtypes;
		    /*
		    * Create the particle.
		    */
		    particle = xmlSchemaAddParticle(pctxt,
			type->node, 1, 1);
		    if (particle == NULL)
			goto exit_failure;
		    /*
		    * Create the "sequence" model group.
		    */
		    particle->children = (xmlSchemaTreeItemPtr)
			xmlSchemaAddModelGroup(pctxt, pctxt->schema,
			XML_SCHEMA_TYPE_SEQUENCE, type->node);
		    if (particle->children == NULL)
			goto exit_failure;
		    WXS_TYPE_CONTENTTYPE(type) = (xmlSchemaTypePtr) particle;
		    /*
		    * SPEC "the particle of the {content type} of
		    * the ... base ..."
		    * Create a duplicate of the base type's particle
		    * and assign its "term" to it.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) xmlSchemaAddParticle(pctxt,
			type->node,
			((xmlSchemaParticlePtr) baseType->subtypes)->minOccurs,
			((xmlSchemaParticlePtr) baseType->subtypes)->maxOccurs);
		    if (particle->children->children == NULL)
			goto exit_failure;
		    particle = (xmlSchemaParticlePtr)
			particle->children->children;
		    particle->children =
			((xmlSchemaParticlePtr) baseType->subtypes)->children;
		    /*
		    * SPEC "followed by the `effective content`."
		    */
		    particle->next = effectiveContent;
		    /*
		    * This all will result in:
		    * new-particle
		    *   --> new-sequence(
		    *         new-particle
		    *           --> base-model,
		    *         this-particle
		    *	        --> this-model
		    *	    )
		    */
		} else {
		    /*
		    * This is the case when there is already an empty
		    * <sequence> with minOccurs==maxOccurs==1.
		    * Just add the base types's content type.
		    * NOTE that, although we miss to add an intermediate
		    * <sequence>, this should produce no difference to
		    * neither the regex compilation of the content model,
		    * nor to the complex type constraints.
		    */
		    particle->children->children =
			(xmlSchemaTreeItemPtr) baseType->subtypes;
		}
	    }
	}
    }
    /*
    * Now fixup attribute uses:
    *   - expand attr. group references
    *     - intersect attribute wildcards
    *   - inherit attribute uses of the base type
    *   - inherit or union attr. wildcards if extending
    *   - apply attr. use prohibitions if restricting
    */
    res = xmlSchemaFixupTypeAttributeUses(pctxt, type);
    HFAILURE HERROR
    /*
    * Apply the complex type component constraints; this will not
    * check attributes, since this is done in
    * xmlSchemaFixupTypeAttributeUses().
    */
    res = xmlSchemaCheckCTComponent(pctxt, type);
    HFAILURE HERROR

    if (olderrs != pctxt->nberrors)
	return(pctxt->err);
    else
	return(0);

exit_error:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(pctxt->err);

exit_failure:
    type->flags |= XML_SCHEMAS_TYPE_INTERNAL_INVALID;
    return(-1);
}